

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedFloats::SerializeWithCachedSizes
          (TensorValue_RepeatedFloats *this,CodedOutputStream *output)

{
  byte *pbVar1;
  Rep *pRVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  uint value;
  float *a;
  
  if ((this->values_).current_size_ < 1) {
    return;
  }
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
    iVar4 = output->buffer_size_;
  }
  else {
    *output->buffer_ = '\n';
    output->buffer_ = output->buffer_ + 1;
    iVar4 = output->buffer_size_ + -1;
    output->buffer_size_ = iVar4;
  }
  value = this->_values_cached_byte_size_;
  if (iVar4 < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar5 = pbVar1;
    uVar6 = value;
    if (0x7f < value) {
      do {
        *pbVar5 = (byte)value | 0x80;
        uVar6 = value >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < value;
        value = uVar6;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar6;
    iVar4 = ((int)pbVar5 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar4;
    output->buffer_size_ = output->buffer_size_ - iVar4;
  }
  pRVar2 = (this->values_).rep_;
  a = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    a = (float *)0x0;
  }
  google::protobuf::internal::WireFormatLite::WriteFloatArray
            (a,(this->values_).current_size_,output);
  return;
}

Assistant:

void TensorValue_RepeatedFloats::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.TensorValue.RepeatedFloats)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float values = 1 [packed = true];
  if (this->values_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_values_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->values().data(), this->values_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.TensorValue.RepeatedFloats)
}